

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGenetic.c
# Opt level: O0

int find_best(void)

{
  int local_10;
  int local_c;
  int small;
  int i;
  
  local_10 = 0;
  for (local_c = 1; local_c < popsize; local_c = local_c + 1) {
    if (storedd[local_c * (numvars + 1) + numvars] < storedd[local_10 * (numvars + 1) + numvars]) {
      local_10 = local_c;
    }
  }
  return local_10;
}

Assistant:

static int
find_best(void)
{
    int i,small;

    small = 0;
    for (i = 1; i < popsize; i++) {
        if (STOREDD(i,numvars) < STOREDD(small,numvars)) {
            small = i;
        }
    }
    return(small);

}